

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::replySslErrors
          (QNetworkReplyHttpImplPrivate *this,QList<QSslError> *list,bool *ignoreAll,
          QList<QSslError> *toBeIgnored)

{
  bool bVar1;
  undefined1 *in_RDX;
  QNetworkReplyHttpImplPrivate *in_RDI;
  QNetworkReplyHttpImpl *q;
  QList<QSslError> *in_stack_ffffffffffffffc8;
  
  q_func(in_RDI);
  QNetworkReply::sslErrors((QNetworkReply *)in_RDI,in_stack_ffffffffffffffc8);
  if ((in_RDI->pendingIgnoreAllSslErrors & 1U) != 0) {
    *in_RDX = 1;
  }
  bVar1 = QList<QSslError>::isEmpty((QList<QSslError> *)0x31e6e6);
  if (!bVar1) {
    QList<QSslError>::operator=((QList<QSslError> *)in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::replySslErrors(
        const QList<QSslError> &list, bool *ignoreAll, QList<QSslError> *toBeIgnored)
{
    Q_Q(QNetworkReplyHttpImpl);
    emit q->sslErrors(list);
    // Check if the callback set any ignore and return this here to http thread
    if (pendingIgnoreAllSslErrors)
        *ignoreAll = true;
    if (!pendingIgnoreSslErrorsList.isEmpty())
        *toBeIgnored = pendingIgnoreSslErrorsList;
}